

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generated_code.cc
# Opt level: O2

void __thiscall GeneratedCode_Maps_Test::~GeneratedCode_Maps_Test(GeneratedCode_Maps_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneratedCode, Maps) {
  upb::Arena arena;
  upb_test_ModelWithMaps* msg = upb_test_ModelWithMaps_new(arena.ptr());

  auto sb = _upb_test_ModelWithMaps_map_sb_mutable_upb_map(msg, arena.ptr());
  auto ss = _upb_test_ModelWithMaps_map_ss_mutable_upb_map(msg, arena.ptr());
  auto ii = _upb_test_ModelWithMaps_map_ii_mutable_upb_map(msg, arena.ptr());

  ASSERT_NE(sb, nullptr);
  ASSERT_NE(ss, nullptr);
  ASSERT_NE(ii, nullptr);

  upb_MessageValue key, val;
  key.str_val = test_str_view;
  val.str_val = test_str_view2;

  upb_Map_Set(sb, key, val, arena.ptr());
}